

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlUnlinkNode(xmlNodePtr cur)

{
  _xmlDoc *p_Var1;
  _xmlNode *p_Var2;
  xmlNodePtr pxVar3;
  xmlNodePtr parent;
  xmlDocPtr doc_1;
  xmlDocPtr doc;
  xmlNodePtr cur_local;
  
  if ((cur != (xmlNodePtr)0x0) && (cur->type != XML_NAMESPACE_DECL)) {
    if ((cur->type == XML_DTD_NODE) && (p_Var1 = cur->doc, p_Var1 != (_xmlDoc *)0x0)) {
      if (p_Var1->intSubset == (_xmlDtd *)cur) {
        p_Var1->intSubset = (_xmlDtd *)0x0;
      }
      if (p_Var1->extSubset == (_xmlDtd *)cur) {
        p_Var1->extSubset = (_xmlDtd *)0x0;
      }
    }
    if ((cur->type == XML_ENTITY_DECL) && (p_Var1 = cur->doc, p_Var1 != (_xmlDoc *)0x0)) {
      if (p_Var1->intSubset != (_xmlDtd *)0x0) {
        pxVar3 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var1->intSubset->entities,cur->name);
        if (pxVar3 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var1->intSubset->entities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
        pxVar3 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var1->intSubset->pentities,cur->name);
        if (pxVar3 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var1->intSubset->pentities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
      }
      if (p_Var1->extSubset != (_xmlDtd *)0x0) {
        pxVar3 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var1->extSubset->entities,cur->name);
        if (pxVar3 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var1->extSubset->entities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
        pxVar3 = (xmlNodePtr)xmlHashLookup((xmlHashTablePtr)p_Var1->extSubset->pentities,cur->name);
        if (pxVar3 == cur) {
          xmlHashRemoveEntry((xmlHashTablePtr)p_Var1->extSubset->pentities,cur->name,
                             (xmlHashDeallocator)0x0);
        }
      }
    }
    if (cur->parent != (_xmlNode *)0x0) {
      p_Var2 = cur->parent;
      if (cur->type == XML_ATTRIBUTE_NODE) {
        if ((xmlNodePtr)p_Var2->properties == cur) {
          p_Var2->properties = (_xmlAttr *)cur->next;
        }
      }
      else {
        if (p_Var2->children == cur) {
          p_Var2->children = cur->next;
        }
        if (p_Var2->last == cur) {
          p_Var2->last = cur->prev;
        }
      }
      cur->parent = (_xmlNode *)0x0;
    }
    if (cur->next != (_xmlNode *)0x0) {
      cur->next->prev = cur->prev;
    }
    if (cur->prev != (_xmlNode *)0x0) {
      cur->prev->next = cur->next;
    }
    cur->prev = (_xmlNode *)0x0;
    cur->next = (_xmlNode *)0x0;
  }
  return;
}

Assistant:

void
xmlUnlinkNode(xmlNodePtr cur) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlUnlinkNode : node == NULL\n");
#endif
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL)
        return;
    if (cur->type == XML_DTD_NODE) {
	xmlDocPtr doc;
	doc = cur->doc;
	if (doc != NULL) {
	    if (doc->intSubset == (xmlDtdPtr) cur)
		doc->intSubset = NULL;
	    if (doc->extSubset == (xmlDtdPtr) cur)
		doc->extSubset = NULL;
	}
    }
    if (cur->type == XML_ENTITY_DECL) {
        xmlDocPtr doc;
	doc = cur->doc;
	if (doc != NULL) {
	    if (doc->intSubset != NULL) {
	        if (xmlHashLookup(doc->intSubset->entities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->intSubset->entities, cur->name,
		                       NULL);
	        if (xmlHashLookup(doc->intSubset->pentities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->intSubset->pentities, cur->name,
		                       NULL);
	    }
	    if (doc->extSubset != NULL) {
	        if (xmlHashLookup(doc->extSubset->entities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->extSubset->entities, cur->name,
		                       NULL);
	        if (xmlHashLookup(doc->extSubset->pentities, cur->name) == cur)
		    xmlHashRemoveEntry(doc->extSubset->pentities, cur->name,
		                       NULL);
	    }
	}
    }
    if (cur->parent != NULL) {
	xmlNodePtr parent;
	parent = cur->parent;
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (parent->properties == (xmlAttrPtr) cur)
		parent->properties = ((xmlAttrPtr) cur)->next;
	} else {
	    if (parent->children == cur)
		parent->children = cur->next;
	    if (parent->last == cur)
		parent->last = cur->prev;
	}
	cur->parent = NULL;
    }
    if (cur->next != NULL)
        cur->next->prev = cur->prev;
    if (cur->prev != NULL)
        cur->prev->next = cur->next;
    cur->next = cur->prev = NULL;
}